

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcHashEntryPpDefine::parse_expansion(CTcHashEntryPpDefine *this,size_t *argvlen)

{
  CTcTokString *pCVar1;
  char cVar2;
  ulong uVar3;
  CTcTokenizer *pCVar4;
  long lVar5;
  tc_toktyp_t tVar6;
  wchar_t wVar7;
  int iVar8;
  CVmHashEntry *pCVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar10;
  undefined4 uVar11;
  undefined8 extraout_RDX;
  undefined7 uVar13;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  undefined8 extraout_RDX_03;
  utf8_ptr p;
  size_t __n;
  long lVar14;
  size_t sVar15;
  long lStack_170;
  undefined1 local_161;
  char *local_158;
  utf8_ptr local_148;
  long local_140;
  ulong local_138;
  ulong local_130;
  undefined4 local_124;
  long local_120;
  CTcTokenizer *local_118;
  size_t *local_110;
  CTcToken tok;
  tok_embed_ctx ec;
  
  if ((this->super_CTcHashEntryPp).argc_ == 0) {
    this->expan_ = this->orig_expan_;
    this->expan_len_ = this->orig_expan_len_;
  }
  else {
    ec.level = 0;
    ec.s = (tok_embed_level *)0x0;
    local_138 = this->orig_expan_len_;
    pCVar1 = &G_tok->defbuf_;
    local_118 = G_tok;
    local_110 = argvlen;
    (*(G_tok->defbuf_)._vptr_CTcTokString[2])();
    local_148.p_ = this->orig_expan_;
    lVar5 = 0;
    local_158 = local_148.p_;
    do {
      while (local_140 = lVar5, tVar6 = CTcTokenizer::next_on_line(&local_148,&tok,&ec,0),
            pcVar10 = tok.text_, tVar6 == TOKT_SYM) {
        pCVar9 = CVmHashTable::find((this->super_CTcHashEntryPp).params_table_,tok.text_,
                                    tok.text_len_);
        lVar5 = local_140;
        if (pCVar9 != (CVmHashEntry *)0x0) {
          local_120 = (long)*(int *)&pCVar9->field_0x24;
          sVar15 = local_110[local_120];
          uVar13 = (undefined7)((ulong)extraout_RDX >> 8);
          uVar11 = (undefined4)CONCAT71(uVar13,1);
          if ((((this->super_CTcHashEntryPp).field_0x44 & 2) == 0) ||
             (uVar11 = (undefined4)CONCAT71(uVar13,1),
             *(int *)&pCVar9->field_0x24 != (this->super_CTcHashEntryPp).argc_ + -1)) {
LAB_0021e37a:
            lStack_170 = 2;
            local_161 = 1;
          }
          else {
            wVar7 = utf8_ptr::s_getch(local_148.p_);
            p.p_ = local_148.p_;
            uVar11 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
            if (wVar7 != L'#') goto LAB_0021e37a;
            iVar8 = bcmp(local_148.p_ + 1,"foreach",7);
            if (iVar8 == 0) {
              wVar7 = utf8_ptr::s_getch_at(p.p_,8);
              iVar8 = is_sym(wVar7);
              p.p_ = local_148.p_;
              if (iVar8 != 0) goto LAB_0021e2d8;
              sVar15 = sVar15 + 8;
              local_161 = 5;
LAB_0021e4a5:
              uVar11 = 0;
              lStack_170 = 1;
            }
            else {
LAB_0021e2d8:
              if (*(long *)(p.p_ + 1) == 0x746e756f63677261) {
                wVar7 = utf8_ptr::s_getch_at(p.p_,9);
                iVar8 = is_sym(wVar7);
                p.p_ = local_148.p_;
                if (iVar8 == 0) {
                  sVar15 = sVar15 + 9;
                  local_161 = 6;
                  goto LAB_0021e4a5;
                }
              }
              iVar8 = bcmp(p.p_ + 1,"ifempty",7);
              uVar12 = extraout_RDX_01;
              if (iVar8 == 0) {
                wVar7 = utf8_ptr::s_getch_at(p.p_,8);
                iVar8 = is_sym(wVar7);
                uVar12 = extraout_RDX_02;
                p.p_ = local_148.p_;
                if (iVar8 == 0) {
                  sVar15 = sVar15 + 8;
                  local_161 = 7;
                  goto LAB_0021e4a5;
                }
              }
              uVar13 = (undefined7)((ulong)uVar12 >> 8);
              if (*(long *)(p.p_ + 1) == 0x7974706d656e6669) {
                wVar7 = utf8_ptr::s_getch_at(p.p_,9);
                iVar8 = is_sym(wVar7);
                uVar13 = (undefined7)((ulong)extraout_RDX_03 >> 8);
                if (iVar8 == 0) {
                  sVar15 = sVar15 + 9;
                  local_161 = 8;
                  goto LAB_0021e4a5;
                }
              }
              uVar11 = (undefined4)CONCAT71(uVar13,1);
              lStack_170 = 2;
              local_161 = 1;
            }
          }
          local_130 = (local_138 - sVar15) + lStack_170;
          local_124 = uVar11;
          if (local_138 < local_130) {
            (*pCVar1->_vptr_CTcTokString[2])(pCVar1,local_130);
          }
          __n = (long)pcVar10 - (long)local_158;
          lVar14 = local_140;
          if (local_158 <= pcVar10 && __n != 0) {
            iVar8 = (*pCVar1->_vptr_CTcTokString[10])();
            memcpy((void *)(CONCAT44(extraout_var,iVar8) + local_140),local_158,__n);
            lVar14 = __n + local_140;
          }
          local_158 = pcVar10 + sVar15;
          iVar8 = (*pCVar1->_vptr_CTcTokString[10])();
          *(undefined1 *)(CONCAT44(extraout_var_00,iVar8) + lVar14) = local_161;
          local_138 = local_130;
          lVar5 = lVar14 + 1;
          if ((char)local_124 != '\0') {
            cVar2 = (char)local_120;
            iVar8 = (*pCVar1->_vptr_CTcTokString[10])();
            *(char *)(CONCAT44(extraout_var_01,iVar8) + 1 + lVar14) = cVar2 + '\x01';
            local_138 = local_130;
            lVar5 = lVar14 + 2;
          }
        }
      }
      lVar5 = local_140;
    } while (tVar6 != TOKT_EOF);
    if (local_158 <= tok.text_ && (long)tok.text_ - (long)local_158 != 0) {
      iVar8 = (*pCVar1->_vptr_CTcTokString[10])(pCVar1);
      memcpy((void *)(local_140 + CONCAT44(extraout_var_02,iVar8)),local_158,
             (long)tok.text_ - (long)local_158);
    }
    pCVar4 = local_118;
    uVar3 = local_138;
    (*(local_118->defbuf_)._vptr_CTcTokString[0xb])(pCVar1,local_138);
    pcVar10 = lib_copy_str((pCVar4->defbuf_).buf_);
    this->expan_ = pcVar10;
    this->expan_len_ = uVar3;
  }
  return;
}

Assistant:

void CTcHashEntryPpDefine::parse_expansion(const size_t *argvlen)
{
    /*
     *   If there are arguments, scan the expansion for formal parameter
     *   names.  For each one we find, replace it with the special
     *   TOK_MACRO_FORMAL_FLAG character followed by a one-byte value giving
     *   the argument index.  This special sequence is less costly to find
     *   when we're expanding the macros - by doing the search here, we only
     *   need to do it once, rather than each time we expand the macro.  
     */
    if (argc_ != 0)
    {
        utf8_ptr src;
        size_t dstofs;
        tc_toktyp_t typ;
        CTcToken tok;
        const char *start;
        tok_embed_ctx ec;
        size_t expan_len = orig_expan_len_;

        /* 
         *   Generate our modified expansion text in the tokenizer's macro
         *   definition scratch buffer.  Initially, make sure we have room
         *   for a copy of the text; we'll resize the buffer later if we find
         *   we need even more.  
         */
        CTcTokString *defbuf = &G_tok->defbuf_;
        defbuf->ensure_space(expan_len);

        /* scan for argument names, and replace them */
        for (start = orig_expan_, dstofs = 0, src.set((char *)orig_expan_) ;; )
        {
            /* get the next token */
            typ = CTcTokenizer::next_on_line(&src, &tok, &ec, FALSE);

            /* if we've reached the end of the expansion, we're done */
            if (typ == TOKT_EOF)
                break;

            /* 
             *   If this is a formal parameter name, we'll replace it with a
             *   special two-byte sequence; otherwise, we'll keep it
             *   unchanged.  
             */
            if (typ == TOKT_SYM)
            {
                /* look up the symbol in our argument table */
                CTcHashEntryPpArg *entry =
                    (CTcHashEntryPpArg *)params_table_->find(
                        tok.get_text(), tok.get_text_len());

                /* check if we found it */
                if (entry != 0)
                {
                    /* get the argument number from the entry */
                    int i = entry->get_argnum();
                    
                    /* get the length of the formal name */
                    size_t arg_len = argvlen[i];

                    /* 
                     *   the normal replacement length for a formal parameter
                     *   is two bytes - one byte for the flag, and one for
                     *   the formal parameter index 
                     */
                    size_t repl_len = 2;

                    /* by default, the flag byte is the formal flag */
                    char flag_byte = TOK_MACRO_FORMAL_FLAG;

                    /*
                     *   Check for special varargs control suffixes.  If we
                     *   matched the last argument name, and this is a
                     *   varargs macro, we might have a suffix.  
                     */
                    if (has_varargs_
                        && i == argc_ - 1
                        && src.getch() == '#')
                    {
                        /* check for the various suffixes */
                        if (memcmp(src.getptr() + 1, "foreach", 7) == 0
                            && !is_sym(src.getch_at(8)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 8;
                            
                            /* 
                             *   the flag byte is the #foreach flag, which is
                             *   a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_FOREACH_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "argcount", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* 
                             *   include the suffix length in the token
                             *   length 
                             */
                            arg_len += 9;
                            
                            /* 
                             *   the flag byte is the #argcount flag, which
                             *   is a one-byte sequence 
                             */
                            flag_byte = TOK_MACRO_ARGCOUNT_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifempty", 7) == 0
                                 && !is_sym(src.getch_at(8)))
                        {
                            /* include the length */
                            arg_len += 8;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFEMPTY_FLAG;
                            repl_len = 1;
                        }
                        else if (memcmp(src.getptr() + 1,
                                        "ifnempty", 8) == 0
                                 && !is_sym(src.getch_at(9)))
                        {
                            /* include the length */
                            arg_len += 9;
                            
                            /* set the one-byte flag */
                            flag_byte = TOK_MACRO_IFNEMPTY_FLAG;
                            repl_len = 1;
                        }
                    }
                    
                    /* 
                     *   calculate the new length - we're removing the
                     *   argument name and adding the replacement string in
                     *   its place 
                     */
                    size_t new_len = expan_len + repl_len - arg_len;
                    
                    /* 
                     *   we need two bytes for the replacement - if this is
                     *   more than we're replacing, make sure we have room
                     *   for the extra 
                     */
                    if (new_len > expan_len)
                        defbuf->ensure_space(new_len);
                    
                    /* 
                     *   copy everything up to but not including the formal
                     *   name 
                     */
                    if (tok.get_text() > start)
                    {
                        /* store the text */
                        memcpy(defbuf->get_buf() + dstofs,
                               start, tok.get_text() - start);
                        
                        /* move past the stored text in the output */
                        dstofs += tok.get_text() - start;
                    }
                    
                    /* the next segment starts after this token */
                    start = tok.get_text() + arg_len;
                    
                    /* store the flag byte */
                    defbuf->get_buf()[dstofs++] = flag_byte;
                    
                    /* 
                     *   If appropriate, store the argument index - this
                     *   always fits in one byte because our hard limit on
                     *   formal parameters is less than 128 per macro.  Note
                     *   that we add one to the index so that we never store
                     *   a zero byte, to avoid any potential confusion with a
                     *   null terminator byte.  
                     */
                    if (repl_len > 1)
                        defbuf->get_buf()[dstofs++] = (char)(i + 1);
                    
                    /* remember the new length */
                    expan_len = new_len;
                }
            }
        }

        /* copy the last segment */
        if (tok.get_text() > start)
            memcpy(defbuf->get_buf() + dstofs, start, tok.get_text() - start);

        /* set the new length */
        defbuf->set_text_len(expan_len);

        /* save the parsed expansion */
        expan_ = lib_copy_str(defbuf->get_text());
        expan_len_ = expan_len;
    }
    else
    {
        /* 
         *   There are no arguments, so there's no parsing we need to do.
         *   Just use the original as the parsed expansion.  
         */
        expan_ = orig_expan_;
        expan_len_ = orig_expan_len_;
    }
}